

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncoderVelocity.cpp
# Opt level: O2

void __thiscall
EncoderVelocity::SetDataRev6(EncoderVelocity *this,uint32_t rawPeriod,uint32_t rawQtr)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  
  Init(this);
  this->clkPeriod = 3.255208333333333e-07;
  this->velPeriodMax = 0x3fffff;
  this->qtrPeriodMax = 0xfffff;
  this->velPeriod = rawPeriod & 0x3fffff;
  uVar2 = rawPeriod >> 0x16 & 0xff | rawQtr >> 0xc & 0xfff00;
  this->qtr1Period = uVar2;
  this->qtr5Period = rawQtr & 0xfffff;
  bVar1 = (byte)(rawPeriod >> 0x18);
  this->velOverflow = (bool)(bVar1 >> 7);
  bVar3 = (bool)(bVar1 >> 6 & 1);
  this->velDir = bVar3;
  if (uVar2 == 0xfffff) {
    this->qtr1Overflow = true;
  }
  if ((rawQtr & 0xfffff) == 0xfffff) {
    this->qtr5Overflow = true;
  }
  this->qtr1Dir = bVar3;
  this->qtr5Dir = bVar3;
  return;
}

Assistant:

void EncoderVelocity::SetDataRev6(uint32_t rawPeriod, uint32_t rawQtr)
{
    Init();
    clkPeriod = VEL_PERD_REV6;
    velPeriodMax = ENC_VEL_MASK_22;
    qtrPeriodMax = ENC_ACC_PREV_MASK;  // 20 bits
    // Firmware 6 has bits stuffed in different places:
    //   Q1: lower 8 bits in velPeriod[29:22] and upper 12 bits in accQtr1[31:20]
    //   Q5: all 20 bits in accQtr1[19:0]
    velPeriod = rawPeriod & ENC_VEL_MASK_22;
    qtr1Period = (((rawQtr & ENC_ACC_REC_MS_MASK)>>12) |
                  ((rawPeriod & ENC_ACC_REC_LS_MASK) >> 22)) & ENC_ACC_PREV_MASK;
    qtr5Period = rawQtr & ENC_ACC_PREV_MASK;
    velOverflow = rawPeriod & ENC_VEL_OVER_MASK;
    velDir = rawPeriod & ENC_DIR_MASK;
    // Qtr1 and Qtr5 overflow at 0x000fffff (no overflow bit is set by firmware)
    if (qtr1Period == qtrPeriodMax)
        qtr1Overflow = true;
    if (qtr5Period == qtrPeriodMax)
        qtr5Overflow = true;
    // Qtr1 and Qtr5 direction are not recorded, so set them same as velDir;
    // i.e., assume that there hasn't been a direction change.
    qtr1Dir = velDir;
    qtr5Dir = velDir;
}